

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::DecimalQuantity::toDecNum
          (DecimalQuantity *this,DecNum *output,UErrorCode *status)

{
  int32_t scale;
  int32_t length;
  uchar uVar1;
  bool isNegative;
  uchar *puVar2;
  uint local_4c;
  undefined1 local_48 [4];
  int32_t m;
  MaybeStackArray<unsigned_char,_20> ubcd;
  UErrorCode *status_local;
  DecNum *output_local;
  DecimalQuantity *this_local;
  
  ubcd._32_8_ = status;
  if (this->precision == 0) {
    DecNum::setTo(output,"0",status);
  }
  MaybeStackArray<unsigned_char,_20>::MaybeStackArray
            ((MaybeStackArray<unsigned_char,_20> *)local_48,this->precision);
  for (local_4c = 0; (int)local_4c < this->precision; local_4c = local_4c + 1) {
    uVar1 = getDigitPos(this,local_4c);
    puVar2 = MaybeStackArray<unsigned_char,_20>::operator[]
                       ((MaybeStackArray<unsigned_char,_20> *)local_48,
                        (long)(int)(~local_4c + this->precision));
    *puVar2 = uVar1;
  }
  puVar2 = MaybeStackArray<unsigned_char,_20>::getAlias
                     ((MaybeStackArray<unsigned_char,_20> *)local_48);
  scale = this->scale;
  length = this->precision;
  isNegative = DecimalQuantity::isNegative(this);
  DecNum::setTo(output,puVar2,length,scale,isNegative,(UErrorCode *)ubcd._32_8_);
  MaybeStackArray<unsigned_char,_20>::~MaybeStackArray
            ((MaybeStackArray<unsigned_char,_20> *)local_48);
  return;
}

Assistant:

void DecimalQuantity::toDecNum(DecNum& output, UErrorCode& status) const {
    // Special handling for zero
    if (precision == 0) {
        output.setTo("0", status);
    }

    // Use the BCD constructor. We need to do a little bit of work to convert, though.
    // The decNumber constructor expects most-significant first, but we store least-significant first.
    MaybeStackArray<uint8_t, 20> ubcd(precision);
    for (int32_t m = 0; m < precision; m++) {
        ubcd[precision - m - 1] = static_cast<uint8_t>(getDigitPos(m));
    }
    output.setTo(ubcd.getAlias(), precision, scale, isNegative(), status);
}